

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,char *ptr,int d)

{
  LogMessage *pLVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  char *pcVar4;
  int overrun;
  pair<const_char_*,_bool> pVar5;
  LogMessage local_230;
  LogMessage local_1f8;
  LogMessage local_1c0;
  LogMessage local_188;
  LogMessage local_150;
  LogMessage local_118;
  LogMessage local_e0;
  LogMessage local_a8;
  LogMessage local_70;
  int local_38;
  LogFinisher local_31;
  
  uVar3 = CONCAT44(in_register_00000014,d);
  local_38 = d;
  if (ptr < this->limit_end_) {
    LogMessage::LogMessage
              (&local_230,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
               ,0x9f);
    pLVar1 = LogMessage::operator<<(&local_230,"CHECK failed: ptr >= limit_end_: ");
    LogFinisher::operator=((LogFinisher *)&local_1c0,pLVar1);
    LogMessage::~LogMessage(&local_230);
    uVar3 = extraout_RDX;
  }
  overrun = (int)ptr - *(int *)&this->buffer_end_;
  if (0x10 < overrun) {
    LogMessage::LogMessage
              (&local_1c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
               ,0xa1);
    pLVar1 = LogMessage::operator<<(&local_1c0,"CHECK failed: overrun <= kSlopBytes: ");
    LogFinisher::operator=((LogFinisher *)&local_188,pLVar1);
    LogMessage::~LogMessage(&local_1c0);
    uVar3 = extraout_RDX_00;
  }
  if (this->limit_ < overrun) {
    pcVar4 = (char *)0x0;
LAB_0023f3e3:
    uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
  }
  else {
    if (this->limit_ == overrun) {
      LogMessage::LogMessage
                (&local_188,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                 ,0xa4);
      pLVar1 = LogMessage::operator<<(&local_188,"CHECK failed: overrun != limit_: ");
      LogFinisher::operator=((LogFinisher *)&local_150,pLVar1);
      LogMessage::~LogMessage(&local_188);
    }
    if (this->limit_ <= overrun) {
      LogMessage::LogMessage
                (&local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                 ,0xa5);
      pLVar1 = LogMessage::operator<<(&local_150,"CHECK failed: overrun < limit_: ");
      LogFinisher::operator=((LogFinisher *)&local_a8,pLVar1);
      LogMessage::~LogMessage(&local_150);
    }
    if (this->limit_end_ != this->buffer_end_ + (this->limit_ >> 0x1f & this->limit_)) {
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                 ,0xaa);
      pLVar1 = LogMessage::operator<<
                         (&local_a8,
                          "CHECK failed: limit_end_ == buffer_end_ + (std::min)(0, limit_): ");
      LogFinisher::operator=((LogFinisher *)&local_118,pLVar1);
      LogMessage::~LogMessage(&local_a8);
    }
    if (this->limit_ < 1) {
      LogMessage::LogMessage
                (&local_118,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                 ,0xac);
      pLVar1 = LogMessage::operator<<(&local_118,"CHECK failed: limit_ > 0: ");
      LogFinisher::operator=((LogFinisher *)&local_70,pLVar1);
      LogMessage::~LogMessage(&local_118);
    }
    pcVar4 = this->limit_end_;
    if (pcVar4 != this->buffer_end_) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                 ,0xad);
      pLVar1 = LogMessage::operator<<(&local_70,"CHECK failed: limit_end_ == buffer_end_: ");
      LogFinisher::operator=((LogFinisher *)&local_e0,pLVar1);
      LogMessage::~LogMessage(&local_70);
    }
    do {
      if (overrun < 0) {
        LogMessage::LogMessage
                  (&local_e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                   ,0xb0);
        pLVar1 = LogMessage::operator<<(&local_e0,"CHECK failed: overrun >= 0: ");
        LogFinisher::operator=(&local_31,pLVar1);
        LogMessage::~LogMessage(&local_e0);
      }
      pcVar2 = Next(this,overrun,local_38);
      uVar3 = extraout_RDX_01;
      if (pcVar2 == (char *)0x0) {
        if (overrun == 0) {
          if (this->limit_ < 1) {
            LogMessage::LogMessage
                      (&local_1f8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/parse_context.cc"
                       ,0xb5);
            pLVar1 = LogMessage::operator<<(&local_1f8,"CHECK failed: limit_ > 0: ");
            LogFinisher::operator=(&local_31,pLVar1);
            LogMessage::~LogMessage(&local_1f8);
            uVar3 = extraout_RDX_02;
          }
          this->limit_end_ = this->buffer_end_;
          this->last_tag_minus_1_ = 1;
          overrun = 0;
          pcVar4 = ptr;
        }
        else {
          pcVar4 = (char *)0x0;
        }
      }
      else {
        this->limit_ = this->limit_ + ((int)pcVar2 - *(int *)&this->buffer_end_);
        ptr = pcVar2 + overrun;
        overrun = (int)ptr - *(int *)&this->buffer_end_;
      }
      if (pcVar2 == (char *)0x0) goto LAB_0023f3e3;
    } while (-1 < overrun);
    this->limit_end_ = this->buffer_end_ + (this->limit_ >> 0x1f & this->limit_);
    uVar3 = 0;
    pcVar4 = ptr;
  }
  pVar5._8_8_ = uVar3;
  pVar5.first = pcVar4;
  return pVar5;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(const char* ptr,
                                                              int d) {
  GOOGLE_DCHECK(ptr >= limit_end_);
  int overrun = ptr - buffer_end_;
  GOOGLE_DCHECK(overrun <= kSlopBytes);  // Guaranteed by parse loop.
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    auto p = Next(overrun, d);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinquish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {ptr, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    ptr = p + overrun;
    overrun = ptr - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {ptr, false};
}